

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

vector * __thiscall lsh::vector::operator&(vector *__return_storage_ptr__,vector *this,vector *v)

{
  pointer puVar1;
  pointer puVar2;
  invalid_argument *this_00;
  ulong uVar3;
  ulong uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> c;
  allocator_type local_41;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  if (this->size_ == v->size_) {
    uVar4 = (long)(this->components_).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->components_).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    uVar3 = (long)uVar4 >> 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_40,uVar3 & 0xffffffff,&local_41);
    if ((int)(uVar4 >> 2) != 0) {
      puVar1 = (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (v->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = 0;
      do {
        local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] = puVar2[uVar4] & puVar1[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uVar3 & 0xffffffff) != uVar4);
    }
    vector(__return_storage_ptr__,&local_40,this->size_);
    if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Invalid vector size");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

unsigned int vector::size() const {
    return this->size_;
  }